

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::quath> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::quath>
          (optional<tinyusdz::value::quath> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::quath> local_1a;
  
  get_value<tinyusdz::value::quath>(&local_1a,this);
  __return_storage_ptr__->has_value_ = local_1a.has_value_;
  if (local_1a.has_value_ == true) {
    __return_storage_ptr__->contained = local_1a.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }